

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap_column.h
# Opt level: O3

bool __thiscall
Gudhi::persistence_matrix::
Heap_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>
::
_multiply_target_and_add<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>>>>
          (Heap_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>
           *this,Field_element *val,
          set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
          *column)

{
  ulong uVar1;
  ID_index IVar2;
  _Rb_tree_color _Var3;
  undefined4 uVar4;
  undefined8 *puVar5;
  _Rb_tree_color *p_Var6;
  long lVar7;
  Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
  *in_RAX;
  _ValueType __value;
  _Rb_tree_node_base *p_Var8;
  undefined4 *puVar9;
  _Base_ptr p_Var10;
  ulong uVar11;
  iterator __end0;
  long lVar12;
  ulong uVar13;
  iterator __begin0;
  undefined8 *puVar14;
  _Rb_tree_header *p_Var15;
  Heap_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>
  *this_00;
  Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
  *local_38;
  
  puVar14 = *(undefined8 **)(this + 8);
  puVar5 = *(undefined8 **)(this + 0x10);
  if (*val == 0) {
    if (puVar14 != puVar5) {
      do {
        operator_delete((void *)*puVar14,8);
        puVar14 = puVar14 + 1;
      } while (puVar14 != puVar5);
      if (*(long *)(this + 0x10) != *(long *)(this + 8)) {
        *(long *)(this + 0x10) = *(long *)(this + 8);
      }
    }
    *(undefined4 *)(this + 0x20) = 0;
  }
  else {
    local_38 = in_RAX;
    if (puVar14 != puVar5) {
      do {
        persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
                  (*(Zp_field_operators<unsigned_int,_void> **)(this + 0x28),(Element *)*puVar14,
                   *val);
        puVar14 = puVar14 + 1;
      } while (puVar14 != puVar5);
      p_Var8 = (column->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        if ((_Rb_tree_header *)p_Var8 == &(column->_M_t)._M_impl.super__Rb_tree_header) {
          if ((ulong)(uint)(*(int *)(this + 0x20) * 2) <=
              (ulong)(*(long *)(this + 0x10) - *(long *)(this + 8) >> 3)) {
            return true;
          }
          Heap_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
          ::_prune((Heap_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                    *)this);
          return true;
        }
        *(int *)(this + 0x20) = *(int *)(this + 0x20) + 1;
        IVar2 = *(ID_index *)&p_Var8[1].field_0x4;
        local_38 = (Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                    *)operator_new(8);
        (local_38->super_Entry_field_element_option).element_ = 0;
        local_38->rowIndex_ = IVar2;
        std::
        vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>>
        ::
        emplace_back<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>
                  ((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>>
                    *)(this + 8),&local_38);
        lVar12 = *(long *)(this + 0x10);
        p_Var6 = *(_Rb_tree_color **)(lVar12 + -8);
        *p_Var6 = p_Var8[1]._M_color;
        lVar7 = *(long *)(this + 8);
        lVar12 = lVar12 - lVar7 >> 3;
        uVar11 = lVar12 - 1;
        if (1 < lVar12) {
          _Var3 = p_Var6[1];
          do {
            uVar1 = uVar11 - 1;
            uVar13 = uVar1 >> 1;
            lVar12 = *(long *)(lVar7 + uVar13 * 8);
            if (_Var3 <= *(_Rb_tree_color *)(lVar12 + 4)) goto LAB_0016bb52;
            *(long *)(lVar7 + uVar11 * 8) = lVar12;
            uVar11 = uVar13;
          } while (1 < uVar1);
          uVar11 = 0;
        }
LAB_0016bb52:
        *(_Rb_tree_color **)(lVar7 + uVar11 * 8) = p_Var6;
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
      } while( true );
    }
  }
  this_00 = this + 8;
  std::
  vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
  ::resize((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
            *)this_00,(column->_M_t)._M_impl.super__Rb_tree_header._M_node_count);
  p_Var10 = (column->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var15 = &(column->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var10 != p_Var15) {
    uVar11 = 0;
    do {
      uVar4 = *(undefined4 *)&p_Var10[1].field_0x4;
      puVar9 = (undefined4 *)operator_new(8);
      *puVar9 = 0;
      puVar9[1] = uVar4;
      *(undefined4 **)(*(long *)this_00 + uVar11 * 8) = puVar9;
      **(_Rb_tree_color **)(*(long *)this_00 + uVar11 * 8) = p_Var10[1]._M_color;
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      uVar11 = (ulong)((int)uVar11 + 1);
    } while ((_Rb_tree_header *)p_Var10 != p_Var15);
  }
  *(int *)(this + 0x20) = (int)((ulong)(*(long *)(this + 0x10) - *(long *)(this + 8)) >> 3);
  return true;
}

Assistant:

inline bool Heap_column<Master_matrix>::_multiply_target_and_add(const Field_element& val, const Entry_range& column)
{
  if (val == 0u) {
    if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
      throw std::invalid_argument("A chain column should not be multiplied by 0.");
      // this would not only mess up the base, but also the pivots stored.
    } else {
      clear();
    }
  }
  if (column_.empty()) {  // chain should never enter here.
    column_.resize(column.size());
    Index i = 0;
    for (const Entry& entry : column) {
      column_[i] = entryPool_->construct(entry.get_row_index());
      column_[i++]->set_element(entry.get_element());
    }
    insertsSinceLastPrune_ = column_.size();
    return true;
  }

  Field_element pivotVal(0);

  for (Entry* entry : column_) {
    operators_->multiply_inplace(entry->get_element(), val);
    if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
      if (entry->get_row_index() == Chain_opt::get_pivot()) operators_->add_inplace(pivotVal, entry->get_element());
    }
  }

  for (const Entry& entry : column) {
    ++insertsSinceLastPrune_;
    if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
      if (entry.get_row_index() == Chain_opt::get_pivot()) operators_->add_inplace(pivotVal, entry.get_element());
    }
    column_.push_back(entryPool_->construct(entry.get_row_index()));
    column_.back()->set_element(entry.get_element());
    std::push_heap(column_.begin(), column_.end(), entryPointerComp_);
  }

  if (2 * insertsSinceLastPrune_ > column_.size()) _prune();

  if constexpr (Master_matrix::Option_list::is_z2)
    return !pivotVal;
  else
    return pivotVal == Field_operators::get_additive_identity();
}